

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O1

int DoJumpIfCloser(AActor *target,VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,
                  int numret)

{
  BlockHeader *pBVar1;
  double dVar2;
  char cVar3;
  AActor *this;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  undefined4 in_register_0000000c;
  VMReturn *this_00;
  FState *state;
  BlockHeader *val;
  char *pcVar7;
  int iVar8;
  bool bVar9;
  double dVar10;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  iVar8 = (int)ret;
  this_00 = (VMReturn *)CONCAT44(in_register_0000000c,numparam);
  if ((*(char *)((long)&stack->UnusedBlocks + 4) != '\x03') ||
     ((*(int *)&stack->UnusedBlocks != 1 && (stack->Blocks != (BlockHeader *)0x0)))) {
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00644451:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4db,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = (AActor *)stack->Blocks;
  if (this != (AActor *)0x0) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar5 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
    }
    pPVar6 = (this->super_DThinker).super_DObject.Class;
    bVar9 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar4 && bVar9) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar4) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00644451;
    }
  }
  iVar5 = (int)param;
  if (iVar5 < 2) {
    pcVar7 = "(paramnum) < numparam";
LAB_00644413:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4dc,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (*(char *)((long)&stack[1].UnusedBlocks + 4) != '\x01') {
    pcVar7 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_00644413;
  }
  if (iVar5 == 2) {
    pcVar7 = "(paramnum) < numparam";
LAB_00644432:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4dd,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((*(char *)((long)&stack[2].UnusedBlocks + 4) != '\x03') ||
     ((pBVar1 = stack[1].Blocks, *(int *)&stack[2].UnusedBlocks != 7 &&
      (stack[2].Blocks != (BlockHeader *)0x0)))) {
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
    ;
    goto LAB_00644432;
  }
  val = stack[2].Blocks;
  if (iVar5 < 4) {
LAB_006442c0:
    bVar9 = false;
  }
  else {
    cVar3 = *(char *)((long)&stack[3].UnusedBlocks + 4);
    if (cVar3 != '\0') {
      if (cVar3 != -1) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x4de,
                      "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      goto LAB_006442c0;
    }
    bVar9 = *(int *)&stack[3].Blocks != 0;
  }
  if (target == (AActor *)0x0) {
    if (iVar8 < 1) {
      return 0;
    }
    if (this_00 == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x4e2,
                    "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  else {
    dVar10 = AActor::Distance2D(this,target,false);
    if (dVar10 < (double)pBVar1) {
      if (!bVar9) {
        dVar10 = (this->__Pos).Z;
        dVar2 = (target->__Pos).Z;
        if (((dVar10 <= dVar2) || ((double)pBVar1 <= dVar10 - (target->Height + dVar2))) &&
           ((dVar2 < dVar10 || ((double)pBVar1 <= dVar2 - (dVar10 + this->Height)))))
        goto LAB_006443b3;
      }
      if (iVar8 < 1) {
        return 0;
      }
      if (this_00 == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x4e9,
                      "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      goto LAB_006443c7;
    }
LAB_006443b3:
    if (iVar8 < 1) {
      return 0;
    }
    if (this_00 == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x4eb,
                    "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  val = (BlockHeader *)0x0;
LAB_006443c7:
  VMReturn::SetPointer(this_00,val,7);
  return 1;
}

Assistant:

static int DoJumpIfCloser(AActor *target, VM_ARGS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT	(dist);
	PARAM_STATE	(jump);
	PARAM_BOOL_OPT(noz) { noz = false; }

	if (!target)
	{ // No target - no jump
		ACTION_RETURN_STATE(NULL);
	}
	if (self->Distance2D(target) < dist &&
		(noz || 
		((self->Z() > target->Z() && self->Z() - target->Top() < dist) ||
		(self->Z() <= target->Z() && target->Z() - self->Top() < dist))))
	{
		ACTION_RETURN_STATE(jump);
	}
	ACTION_RETURN_STATE(NULL);
}